

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86instapi.cpp
# Opt level: O1

uint32_t asmjit::x86::InstInternal::stringToInstId(uint32_t arch,char *s,size_t len)

{
  ushort uVar1;
  bool bVar2;
  uint uVar3;
  undefined1 *puVar4;
  ulong uVar5;
  ulong uVar6;
  uint unaff_EBP;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  byte *pbVar10;
  
  if (s != (char *)0x0) {
    if (len == 0xffffffffffffffff) {
      len = strlen(s);
    }
    uVar7 = 0;
    if ((0xffffffffffffffee < len - 0x12) && (uVar3 = (int)*s - 0x61, uVar3 < 0x1a)) {
      uVar1 = *(ushort *)(InstDB::instNameIndex + (ulong)uVar3 * 4);
      if (((ulong)uVar1 != 0) &&
         (uVar5 = (ulong)*(ushort *)(InstDB::instNameIndex + (ulong)uVar3 * 4 + 2) - (ulong)uVar1,
         uVar5 != 0)) {
        puVar4 = InstDB::_instInfoTable + (ulong)uVar1 * 8;
        do {
          uVar8 = uVar5 & 0xfffffffffffffffe;
          pbVar10 = &InstDB::_nameData + (*(uint *)(puVar4 + uVar8 * 4) & 0x3fff);
          bVar2 = len != 0;
          if ((len != 0) && (unaff_EBP = (uint)*pbVar10 - (uint)(byte)*s, *pbVar10 == *s)) {
            uVar6 = 1;
            do {
              uVar9 = uVar6;
              uVar3 = unaff_EBP;
              if (len == uVar9) break;
              uVar6 = uVar9 + 1;
              uVar3 = (uint)pbVar10[uVar9] - (uint)(byte)s[uVar9];
            } while (pbVar10[uVar9] == s[uVar9]);
            unaff_EBP = uVar3;
            bVar2 = uVar9 < len;
          }
          if (!bVar2) {
            unaff_EBP = (uint)pbVar10[len];
          }
          if ((int)unaff_EBP < 0) {
            puVar4 = puVar4 + uVar8 * 4 + 8;
            uVar6 = uVar5 - 1;
            bVar2 = true;
          }
          else {
            bVar2 = true;
            uVar6 = uVar5;
            if (unaff_EBP == 0) {
              bVar2 = false;
              uVar7 = (ulong)(puVar4 + uVar8 * 4 + -0x140670) >> 3 & 0xffffffff;
            }
          }
          if (!bVar2) {
            return (uint32_t)uVar7;
          }
          uVar5 = uVar6 >> 1;
        } while (1 < uVar6);
      }
    }
  }
  return 0;
}

Assistant:

uint32_t InstInternal::stringToInstId(uint32_t arch, const char* s, size_t len) noexcept {
  DebugUtils::unused(arch);

  if (ASMJIT_UNLIKELY(!s))
    return Inst::kIdNone;

  if (len == SIZE_MAX)
    len = strlen(s);

  if (ASMJIT_UNLIKELY(len == 0 || len > InstDB::kMaxNameSize))
    return Inst::kIdNone;

  uint32_t prefix = uint32_t(s[0]) - 'a';
  if (ASMJIT_UNLIKELY(prefix > 'z' - 'a'))
    return Inst::kIdNone;

  uint32_t index = InstDB::instNameIndex[prefix].start;
  if (ASMJIT_UNLIKELY(!index))
    return Inst::kIdNone;

  const char* nameData = InstDB::_nameData;
  const InstDB::InstInfo* table = InstDB::_instInfoTable;

  const InstDB::InstInfo* base = table + index;
  const InstDB::InstInfo* end  = table + InstDB::instNameIndex[prefix].end;

  for (size_t lim = (size_t)(end - base); lim != 0; lim >>= 1) {
    const InstDB::InstInfo* cur = base + (lim >> 1);
    int result = Support::cmpInstName(nameData + cur[0]._nameDataIndex, s, len);

    if (result < 0) {
      base = cur + 1;
      lim--;
      continue;
    }

    if (result > 0)
      continue;

    return uint32_t((size_t)(cur - table));
  }

  return Inst::kIdNone;
}